

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O0

int ProcessRawProfile(char *profile,size_t profile_len,MetadataPayload *payload)

{
  long lVar1;
  uint8_t *puVar2;
  long *in_RDX;
  long in_RSI;
  char *in_RDI;
  bool bVar3;
  int expected_length;
  char *end;
  char *src;
  char *local_30;
  char *local_28;
  long *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == 0)) {
    iVar4 = 0;
  }
  else if (*in_RDI == '\n') {
    local_28 = in_RDI + 1;
    do {
      bVar3 = false;
      if (*local_28 != '\0') {
        bVar3 = *local_28 != '\n';
        local_28 = local_28 + 1;
      }
    } while (bVar3);
    local_20 = in_RDX;
    lVar1 = strtol(local_28,&local_30,10);
    if (*local_30 == '\n') {
      local_30 = local_30 + 1;
      puVar2 = HexStringToBytes((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),(size_t)in_RDI);
      *local_20 = (long)puVar2;
      if (*local_20 == 0) {
        iVar4 = 0;
      }
      else {
        local_20[1] = (long)(int)lVar1;
        iVar4 = 1;
      }
    }
    else {
      fprintf(_stderr,"Malformed raw profile, expected \'\\n\' got \'\\x%.2X\'\n",
              (ulong)(uint)(int)*local_30);
      iVar4 = 0;
    }
  }
  else {
    fprintf(_stderr,"Malformed raw profile, expected \'\\n\' got \'\\x%.2X\'\n",
            (ulong)(uint)(int)*in_RDI);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int ProcessRawProfile(const char* profile, size_t profile_len,
                             MetadataPayload* const payload) {
  const char* src = profile;
  char* end;
  int expected_length;

  if (profile == NULL || profile_len == 0) return 0;

  // ImageMagick formats 'raw profiles' as
  // '\n<name>\n<length>(%8lu)\n<hex payload>\n'.
  if (*src != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *src);
    return 0;
  }
  ++src;
  // skip the profile name and extract the length.
  while (*src != '\0' && *src++ != '\n') {}
  expected_length = (int)strtol(src, &end, 10);
  if (*end != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *end);
    return 0;
  }
  ++end;

  // 'end' now points to the profile payload.
  payload->bytes = HexStringToBytes(end, expected_length);
  if (payload->bytes == NULL) return 0;
  payload->size = expected_length;
  return 1;
}